

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

void __thiscall
TPZFMatrix<long>::InitializeEqualFromList
          (TPZFMatrix<long> *this,initializer_list<std::initializer_list<long>_> *list)

{
  size_type sVar1;
  const_iterator piVar2;
  size_type sVar3;
  const_iterator plVar4;
  initializer_list<std::initializer_list<long>_> *in_RSI;
  long *in_RDI;
  uint32_t col_n;
  const_iterator col_it_end;
  const_iterator col_it;
  uint32_t row_n;
  const_iterator row_it_end;
  const_iterator row_it;
  size_t n_col;
  size_t n_row;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  const_iterator local_40;
  uint local_34;
  initializer_list<long> *local_28;
  
  sVar1 = std::initializer_list<std::initializer_list<long>_>::size(in_RSI);
  local_28 = std::initializer_list<std::initializer_list<long>_>::begin(in_RSI);
  piVar2 = std::initializer_list<std::initializer_list<long>_>::end
                     ((initializer_list<std::initializer_list<long>_> *)
                      CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  sVar3 = std::initializer_list<long>::size(local_28);
  (**(code **)(*in_RDI + 0x68))(in_RDI,sVar1,sVar3);
  local_34 = 0;
  for (; local_28 != piVar2; local_28 = local_28 + 1) {
    local_40 = std::initializer_list<long>::begin(local_28);
    plVar4 = std::initializer_list<long>::end
                       ((initializer_list<long> *)
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    in_stack_ffffffffffffffb4 = 0;
    for (; local_40 != plVar4; local_40 = local_40 + 1) {
      *(long *)(in_RDI[4] + ((ulong)in_stack_ffffffffffffffb4 * in_RDI[1] + (ulong)local_34) * 8) =
           *local_40;
      in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1;
    }
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::InitializeEqualFromList (const std::initializer_list< std::initializer_list<TVar> >& list){
    size_t n_row = list.size();
    size_t n_col = 1;

    auto row_it = list.begin();
    auto row_it_end = list.end();

#ifdef PZDEBUG
    bool col_n_found = false;
    for (auto it = row_it; it != row_it_end; it++) {
        if (!col_n_found) {
            n_col = it->size();
            col_n_found = true;
        }
        else {
            if (n_col != it->size())
                this->Error("TPZFMatrix constructor: inconsistent number of columns in initializer list");
        }
    }
#else
    n_col = row_it->size();
#endif
    this->Resize(n_row, n_col);

    for (uint32_t row_n = 0; row_it != row_it_end; row_it++, row_n++) {
        auto col_it = row_it->begin();
        auto col_it_end = row_it->end();
        for (uint32_t col_n = 0; col_it != col_it_end; col_it++, col_n++) {
            this->fElem[col_n * this->fRow + row_n] = *col_it;
        }
    }
}